

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
bwtil::cgap_dictionary::bitvector_to_gaps
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<bool,_std::allocator<bool>_> *B)

{
  ulong uVar1;
  ulint i;
  ulong __n;
  reference rVar2;
  value_type local_38;
  unsigned_long local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = 1;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n = 0; uVar1 = (ulong)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                        + ((long)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                          (long)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8
      , __n < uVar1; __n = __n + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](B,__n);
    if ((*rVar2._M_p & rVar2._M_mask) == 0) {
      local_38 = local_38 + 1;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (__return_storage_ptr__,&local_38);
      local_38 = 1;
    }
  }
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](B,uVar1 - 1);
  if ((*rVar2._M_p & rVar2._M_mask) == 0) {
    local_30 = local_38 - 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<ulint> bitvector_to_gaps(vector<bool> &B){

		ulint gap_len=1;
		vector<ulint> gaps;

		for(ulint i=0;i<B.size();++i){

			if(B[i]){

				gaps.push_back(gap_len);
				gap_len=1;

			}else{
				gap_len++;
			}

		}

		if(not B[B.size()-1])
			gaps.push_back(gap_len-1);

		assert(gaps.size()>0);

		return gaps;

	}